

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildStruct(CNscPStackEntry *pId,CNscPStackEntry *pList)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  NscSymbol *pNVar4;
  CNwnDoubleLinkList *pCVar5;
  CNwnDoubleLinkList *pNext_1;
  NscMessage nMessage;
  
  if (pId == (CNscPStackEntry *)0x0) {
    __assert_fail("pId",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x9c9,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (pList != (CNscPStackEntry *)0x0) {
    if (((pList->m_nType != NscType_Error) && (pId->m_nType != NscType_Error)) &&
       (g_pCtx->m_fPhase2 == false)) {
      pNVar4 = CNscSymbolTable::FindByType(&g_pCtx->m_sSymbols,pId->m_pszId,0xc);
      if (pNVar4 == (NscSymbol *)0x0) {
        CNscContext::AddStructure(g_pCtx,pId->m_pszId,pList->m_pauchData,pList->m_nDataSize);
      }
      else {
        if (pNVar4->nSymType == NscSymType_Structure) {
          nMessage = NscMessage_ErrorStructureRedefined;
        }
        else {
          nMessage = NscMessage_ErrorStructSymbolTypeMismatch;
        }
        CNscContext::GenerateMessage(g_pCtx,nMessage,pId->m_pszId,pNVar4);
      }
    }
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pId->m_link).m_pNext;
    if (pCVar2 != pId) {
      pCVar5 = (pId->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pId->m_link).m_pNext = &pId->m_link;
      (pId->m_link).m_pPrev = &pId->m_link;
    }
    pCVar5 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pId) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pId->m_link).m_pNext = pCVar1;
    (pId->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pId->m_link;
    pCVar1->m_pPrev = &pId->m_link;
    pCVar3 = g_pCtx;
    pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
    pCVar2 = (CNscPStackEntry *)(pList->m_link).m_pNext;
    if (pCVar2 != pList) {
      pCVar5 = (pList->m_link).m_pPrev;
      (pCVar2->m_link).m_pPrev = pCVar5;
      pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar2;
      (pList->m_link).m_pNext = &pList->m_link;
      (pList->m_link).m_pPrev = &pList->m_link;
    }
    pCVar5 = &pCVar3->m_listEntryFree;
    if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pList) {
      pCVar5 = pCVar1;
    }
    pCVar1 = pCVar5->m_pNext;
    (pList->m_link).m_pNext = pCVar1;
    (pList->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = &pList->m_link;
    pCVar1->m_pPrev = &pList->m_link;
    return (CNscPStackEntry *)0x0;
  }
  __assert_fail("pList",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                ,0x9ca,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
}

Assistant:

YYSTYPE NscBuildStruct (YYSTYPE pId, YYSTYPE pList)
{
	assert (pId);
	assert (pList);

	//
	// Check for silent errors
	//

	if (pList ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error)
	{
	}

	//
	// Add the structure
	//

	else
	{
		if (!g_pCtx ->IsPhase2 ())
		{
			NscSymbol *pSymbol;
			bool fProblem;

			pSymbol = g_pCtx ->FindStructTagSymbol (pId ->GetIdentifier ());
			fProblem = false;

			//
			// Check that the symbol is not already defined.  Note that the
			// standard compiler silently allows this in some cases but does
			// not function correctly.  It's best to just flag this as a hard
			// error as the standard scripts do not have the problem.
			//

			if (pSymbol != NULL)
			{
				if (pSymbol ->nSymType == NscSymType_Structure)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorStructureRedefined,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
				else
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorStructSymbolTypeMismatch,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
			}

			if (!fProblem)
			{
				g_pCtx ->AddStructure (pId ->GetIdentifier (),
					pList ->GetData (), pList ->GetDataSize ());
			}
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pId);
    g_pCtx ->FreePStackEntry (pList);
	return NULL;
}